

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<void*>,testing::Matcher<unsigned_long>>,std::tuple<void*,unsigned_long>>
               (tuple<testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_> *matcher_tuple,
               tuple<void_*,_unsigned_long> *value_tuple)

{
  bool bVar1;
  tuple<testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_> *in_RSI;
  unsigned_long in_stack_00000008;
  MatcherBase<unsigned_long> *in_stack_00000010;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  bool bVar2;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<void*>,testing::Matcher<unsigned_long>>,std::tuple<void*,unsigned_long>>
                    (in_RSI,(tuple<void_*,_unsigned_long> *)
                            CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  bVar2 = false;
  if (bVar1) {
    std::get<1ul,testing::Matcher<void*>,testing::Matcher<unsigned_long>>
              ((tuple<testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_> *)0x1b14f6);
    std::get<1ul,void*,unsigned_long>((tuple<void_*,_unsigned_long> *)0x1b1505);
    bVar2 = MatcherBase<unsigned_long>::Matches(in_stack_00000010,in_stack_00000008);
  }
  return bVar2;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }